

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<std::vector<bool,_std::allocator<bool>_>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::vector<bool,std::allocator<bool>>>
          (optional<std::vector<bool,_std::allocator<bool>_>_> *__return_storage_ptr__,PrimVar *this
          )

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  optional<std::vector<bool,_std::allocator<bool>_>_> local_40;
  
  get_value<std::vector<bool,std::allocator<bool>>>(&local_40,this);
  uVar3 = local_40.contained._16_8_;
  uVar2 = local_40.contained.data._0_8_;
  __return_storage_ptr__->has_value_ = local_40.has_value_;
  if (local_40.has_value_ == true) {
    uVar1 = CONCAT44(local_40.contained._12_4_,local_40.contained._8_4_);
    local_40.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_40.contained._8_4_ = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = local_40.contained._32_8_;
    local_40.contained._16_8_ = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = uVar3;
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x18) =
         CONCAT44(local_40.contained._28_4_,local_40.contained._24_4_);
    local_40.contained._24_4_ = 0;
    *(undefined8 *)&__return_storage_ptr__->contained = uVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = uVar1;
    local_40.contained._32_8_ = 0;
  }
  nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional(&local_40);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }